

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Logger.cpp
# Opt level: O1

void __thiscall Logger::Impl::Impl(Impl *this,char *fileName,int line)

{
  char *pcVar1;
  LogStream *pLVar2;
  char **ppcVar3;
  int *in_FS_OFFSET;
  allocator local_19;
  
  ppcVar3 = &(this->stream_).buffer_.cur_;
  (this->stream_).buffer_.cur_ = (this->stream_).buffer_.data_;
  this->line_ = line;
  std::__cxx11::string::string((string *)&this->basename_,fileName,&local_19);
  formatTime(this);
  pcVar1 = (this->stream_).buffer_.cur_;
  if (7 < (int)ppcVar3 - (int)pcVar1) {
    builtin_strncpy(pcVar1,"Thread ",7);
    *ppcVar3 = *ppcVar3 + 7;
  }
  if (*in_FS_OFFSET == 0) {
    CurrentThread::cacheTid();
  }
  pLVar2 = LogStream::operator<<(&this->stream_,*in_FS_OFFSET);
  ppcVar3 = &(pLVar2->buffer_).cur_;
  pcVar1 = (pLVar2->buffer_).cur_;
  if (2 < (int)ppcVar3 - (int)pcVar1) {
    pcVar1[0] = ':';
    pcVar1[1] = ' ';
    *ppcVar3 = *ppcVar3 + 2;
  }
  return;
}

Assistant:

Logger::Impl::Impl(const char* fileName, int line)
    : stream_(),
      line_(line),
      basename_(fileName) {
    formatTime();
    stream_ << "Thread " << CurrentThread::tid() << ": ";
}